

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  __m256i c;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  ulong uVar9;
  parasail_result_t *ppVar10;
  __m256i *b;
  __m256i *ptr;
  __m256i *b_00;
  __m256i *__dest;
  __m256i *ptr_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  __m256i *palVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong size;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int iVar106;
  undefined1 local_d8 [32];
  undefined1 auVar87 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar1 = (profile->profile64).score;
    if (pvVar1 == (void *)0x0) {
      parasail_sw_table_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar28 = profile->s1Len;
        uVar9 = (ulong)uVar28;
        if ((int)uVar28 < 1) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_1();
        }
        else {
          uVar19 = uVar9 + 3;
          uVar35 = (ulong)(uint)open;
          iVar106 = ppVar2->min;
          uVar16 = 0x8000000000000000 - (long)iVar106;
          if (iVar106 != -open && SBORROW4(iVar106,-open) == iVar106 + open < 0) {
            uVar16 = uVar35 | 0x8000000000000000;
          }
          iVar106 = ppVar2->max;
          ppVar10 = parasail_result_new_table1((uint)uVar19 & 0x7ffffffc,s2Len);
          if (ppVar10 != (parasail_result_t *)0x0) {
            size = uVar19 >> 2;
            ppVar10->flag = ppVar10->flag | 0x4820404;
            b = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            __dest = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            if (ptr_00 != (__m256i *)0x0 &&
                ((__dest != (__m256i *)0x0 && b_00 != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && b != (__m256i *)0x0))) {
              auVar48._4_4_ = 0;
              auVar48._0_4_ = gap;
              auVar48._8_4_ = gap;
              auVar48._12_4_ = 0;
              auVar48._16_4_ = gap;
              auVar48._20_4_ = 0;
              auVar48._24_4_ = gap;
              auVar48._28_4_ = 0;
              uVar16 = uVar16 + 1;
              lVar22 = 0x7ffffffffffffffe - (long)iVar106;
              uVar36 = (uint)size;
              lVar17 = (long)(int)-(gap * uVar36);
              auVar49._8_8_ = lVar17;
              auVar49._0_8_ = lVar17;
              auVar49._16_8_ = lVar17;
              auVar49._24_8_ = lVar17;
              auVar49 = vpblendd_avx2(auVar49,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar49 = vpaddq_avx2(ZEXT832(uVar16),auVar49);
              alVar4[1]._0_4_ = in_stack_fffffffffffffdd0;
              alVar4[0] = (longlong)ppVar10;
              alVar4[1]._4_4_ = in_stack_fffffffffffffdd4;
              alVar4[2] = uVar16;
              alVar4[3] = uVar35;
              uVar25 = uVar16;
              uVar11 = uVar35;
              parasail_memset___m256i(b_00,alVar4,size);
              c[1]._0_4_ = in_stack_fffffffffffffdd0;
              c[0] = (longlong)ppVar10;
              c[1]._4_4_ = in_stack_fffffffffffffdd4;
              c[2] = uVar25;
              c[3] = uVar11;
              parasail_memset___m256i(b,c,size);
              auVar5._8_8_ = uVar35;
              auVar5._0_8_ = uVar35;
              auVar5._16_8_ = uVar35;
              auVar5._24_8_ = uVar35;
              auVar105 = ZEXT3264(auVar5);
              alVar4 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar5);
              palVar18 = ptr_00 + (uVar36 - 1);
              uVar11 = size;
              do {
                *palVar18 = alVar4;
                alVar4 = (__m256i)vpsubq_avx2((undefined1  [32])alVar4,auVar48);
                palVar18 = palVar18 + -1;
                iVar106 = (int)uVar11;
                uVar20 = iVar106 - 1;
                uVar11 = (ulong)uVar20;
              } while (uVar20 != 0 && 0 < iVar106);
              uVar11 = 1;
              if (1 < s2Len) {
                uVar11 = (ulong)(uint)s2Len;
              }
              lVar37 = (ulong)(uVar36 + (uVar36 == 0)) << 5;
              lVar26 = size * (uint)s2Len;
              lVar17 = 0;
              uVar43 = 0;
              iVar106 = 0;
              local_d8._8_8_ = uVar16;
              local_d8._0_8_ = uVar16;
              local_d8._16_8_ = uVar16;
              local_d8._24_8_ = uVar16;
              auVar92._8_8_ = lVar22;
              auVar92._0_8_ = lVar22;
              auVar92._16_8_ = lVar22;
              auVar92._24_8_ = lVar22;
              auVar97 = local_d8;
              auVar104 = local_d8;
              do {
                iVar8 = ppVar2->mapper[(byte)s2[uVar43]];
                alVar4 = b_00[uVar36 - 1];
                auVar5 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                auVar5 = vpalignr_avx2((undefined1  [32])alVar4,auVar5,8);
                lVar30 = 0;
                auVar63._8_8_ = uVar16;
                auVar63._0_8_ = uVar16;
                auVar63._16_8_ = uVar16;
                auVar63._24_8_ = uVar16;
                auVar76 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar74 = vpaddq_avx2(auVar5,*(undefined1 (*) [32])
                                                ((long)pvVar1 + lVar30 + size * (long)iVar8 * 0x20))
                  ;
                  auVar5 = *(undefined1 (*) [32])((long)*b_00 + lVar30);
                  auVar87 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b + lVar30),auVar48);
                  auVar50 = vpsubq_avx2(auVar5,auVar105._0_32_);
                  uVar31 = auVar50._0_8_;
                  if ((long)auVar50._0_8_ < (long)auVar87._0_8_) {
                    uVar31 = auVar87._0_8_;
                  }
                  uVar12 = vpextrq_avx(auVar87._0_16_,1);
                  uVar21 = vpextrq_avx(auVar50._0_16_,1);
                  if ((long)uVar21 < (long)uVar12) {
                    uVar21 = uVar12;
                  }
                  uVar12 = auVar50._16_8_;
                  if ((long)auVar50._16_8_ < (long)auVar87._16_8_) {
                    uVar12 = auVar87._16_8_;
                  }
                  uVar13 = vpextrq_avx(auVar87._16_16_,1);
                  uVar23 = vpextrq_avx(auVar50._16_16_,1);
                  if ((long)uVar23 < (long)uVar13) {
                    uVar23 = uVar13;
                  }
                  auVar87 = vpaddq_avx2(auVar76._0_32_,
                                        *(undefined1 (*) [32])((long)*ptr_00 + lVar30));
                  uVar13 = auVar87._0_8_;
                  if ((long)auVar87._0_8_ < (long)auVar63._0_8_) {
                    uVar13 = auVar63._0_8_;
                  }
                  uVar14 = vpextrq_avx(auVar63._0_16_,1);
                  uVar32 = vpextrq_avx(auVar87._0_16_,1);
                  if ((long)uVar32 < (long)uVar14) {
                    uVar32 = uVar14;
                  }
                  uVar14 = auVar87._16_8_;
                  if ((long)auVar87._16_8_ < (long)auVar63._16_8_) {
                    uVar14 = auVar63._16_8_;
                  }
                  uVar38 = vpextrq_avx(auVar63._16_16_,1);
                  uVar15 = vpextrq_avx(auVar87._16_16_,1);
                  if ((long)uVar15 < (long)uVar38) {
                    uVar15 = uVar38;
                  }
                  uVar38 = uVar31;
                  if ((long)uVar31 <= (long)auVar74._0_8_) {
                    uVar38 = auVar74._0_8_;
                  }
                  uVar39 = vpextrq_avx(auVar74._0_16_,1);
                  uVar34 = uVar21;
                  if ((long)uVar21 <= (long)uVar39) {
                    uVar34 = uVar39;
                  }
                  uVar39 = uVar12;
                  if ((long)uVar12 <= (long)auVar74._16_8_) {
                    uVar39 = auVar74._16_8_;
                  }
                  uVar40 = vpextrq_avx(auVar74._16_16_,1);
                  uVar41 = uVar23;
                  if ((long)uVar23 <= (long)uVar40) {
                    uVar41 = uVar40;
                  }
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uVar31;
                  auVar83._8_8_ = 0;
                  auVar83._0_8_ = uVar21;
                  auVar55 = vpunpcklqdq_avx(auVar55,auVar83);
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar23;
                  auVar90._8_8_ = 0;
                  auVar90._0_8_ = uVar12;
                  auVar64 = vpunpcklqdq_avx(auVar90,auVar64);
                  auVar56._8_8_ = 0;
                  auVar56._0_8_ = uVar15;
                  auVar65._8_8_ = 0;
                  auVar65._0_8_ = uVar14;
                  auVar56 = vpunpcklqdq_avx(auVar65,auVar56);
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = uVar32;
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = uVar13;
                  auVar65 = vpunpcklqdq_avx(auVar77,auVar66);
                  auVar63._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar65;
                  auVar63._16_16_ = ZEXT116(1) * auVar56;
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = uVar38;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = uVar34;
                  auVar56 = vpunpcklqdq_avx(auVar67,auVar78);
                  auVar84._8_8_ = 0;
                  auVar84._0_8_ = uVar39;
                  auVar87._0_16_ = ZEXT116(0) * auVar84 + ZEXT116(1) * auVar56;
                  auVar87._16_16_ = ZEXT116(1) * auVar84;
                  auVar74._8_8_ = uVar41;
                  auVar74._0_8_ = uVar41;
                  auVar74._16_8_ = uVar41;
                  auVar74._24_8_ = uVar41;
                  auVar74 = vpblendd_avx2(auVar87,auVar74,0xc0);
                  auVar76 = ZEXT3264(auVar74);
                  *(undefined1 (*) [16])((long)*b + lVar30 + 0x10) = auVar64;
                  *(undefined1 (*) [16])((long)*b + lVar30) = auVar55;
                  *(undefined1 (*) [32])((long)*ptr + lVar30) = auVar74;
                  lVar30 = lVar30 + 0x20;
                } while (lVar37 != lVar30);
                auVar44._8_8_ = uVar34;
                auVar44._0_8_ = uVar34;
                auVar50._16_16_ = ZEXT116(1) * auVar44;
                auVar50._0_16_ = ZEXT116(0) * auVar44;
                auVar5 = vpalignr_avx2(auVar87,auVar50,8);
                auVar5 = vpaddq_avx2(auVar5,(undefined1  [32])*ptr_00);
                uVar31 = auVar5._0_8_;
                if ((long)auVar5._0_8_ < (long)uVar13) {
                  uVar31 = uVar13;
                }
                uVar21 = vpextrq_avx(auVar5._0_16_,1);
                if ((long)uVar21 < (long)uVar32) {
                  uVar21 = uVar32;
                }
                uVar12 = auVar5._16_8_;
                if ((long)auVar5._16_8_ < (long)uVar14) {
                  uVar12 = uVar14;
                }
                uVar23 = vpextrq_avx(auVar5._16_16_,1);
                if ((long)uVar23 < (long)uVar15) {
                  uVar23 = uVar15;
                }
                auVar45._8_8_ = 0;
                auVar45._0_8_ = uVar23;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = uVar12;
                auVar55 = vpunpcklqdq_avx(auVar57,auVar45);
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar21;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar31;
                auVar64 = vpunpcklqdq_avx(auVar68,auVar58);
                auVar51._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar64;
                auVar51._16_16_ = ZEXT116(1) * auVar55;
                iVar8 = 1;
                do {
                  auVar5 = vperm2i128_avx2(auVar51,auVar51,8);
                  auVar5 = vpalignr_avx2(auVar51,auVar5,8);
                  auVar5 = vpaddq_avx2(auVar49,auVar5);
                  uVar31 = auVar5._0_8_;
                  if ((long)auVar5._0_8_ < (long)auVar51._0_8_) {
                    uVar31 = auVar51._0_8_;
                  }
                  uVar12 = vpextrq_avx(auVar51._0_16_,1);
                  uVar21 = vpextrq_avx(auVar5._0_16_,1);
                  if ((long)uVar21 < (long)uVar12) {
                    uVar21 = uVar12;
                  }
                  uVar12 = auVar5._16_8_;
                  if ((long)auVar5._16_8_ < (long)auVar51._16_8_) {
                    uVar12 = auVar51._16_8_;
                  }
                  auVar59._8_8_ = 0;
                  auVar59._0_8_ = uVar21;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar31;
                  auVar55 = vpunpcklqdq_avx(auVar79,auVar59);
                  lVar29 = vpextrq_avx(auVar51._16_16_,1);
                  lVar30 = vpextrq_avx(auVar5._16_16_,1);
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = uVar12;
                  auVar75._0_16_ = ZEXT116(0) * auVar85 + ZEXT116(1) * auVar55;
                  auVar75._16_16_ = ZEXT116(1) * auVar85;
                  if (lVar30 < lVar29) {
                    lVar30 = lVar29;
                  }
                  auVar52._8_8_ = lVar30;
                  auVar52._0_8_ = lVar30;
                  auVar52._16_8_ = lVar30;
                  auVar52._24_8_ = lVar30;
                  auVar51 = vpblendd_avx2(auVar75,auVar52,0xc0);
                  iVar8 = iVar8 + -1;
                } while (iVar8 == 0);
                auVar46._8_8_ = uVar21;
                auVar46._0_8_ = uVar21;
                auVar53._16_16_ = ZEXT116(1) * auVar46;
                auVar53._0_16_ = ZEXT116(0) * auVar46;
                auVar5 = vpalignr_avx2(auVar75,auVar53,8);
                auVar54 = vpaddq_avx2(auVar5,ZEXT832(uVar16));
                uVar31 = vpextrq_avx(auVar54._0_16_,1);
                if ((long)uVar31 < (long)uVar38) {
                  uVar31 = uVar38;
                }
                uVar21 = auVar54._16_8_;
                if ((long)auVar54._16_8_ < (long)uVar34) {
                  uVar21 = uVar34;
                }
                uVar12 = vpextrq_avx(auVar54._16_16_,1);
                if ((long)uVar12 < (long)uVar39) {
                  uVar12 = uVar39;
                }
                auVar60._8_8_ = 0;
                auVar60._0_8_ = ~((long)uVar12 >> 0x3f) & uVar12;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = ~((long)uVar21 >> 0x3f) & uVar21;
                auVar55 = vpunpcklqdq_avx(auVar69,auVar60);
                auVar70._8_8_ = 0;
                auVar70._0_8_ = ~((long)uVar31 >> 0x3f) & uVar31;
                auVar80._8_8_ = 0;
                auVar80._0_8_ = ~((long)auVar54._0_8_ >> 0x3f) & auVar54._0_8_;
                auVar64 = vpunpcklqdq_avx(auVar80,auVar70);
                auVar88._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar64;
                auVar88._16_16_ = ZEXT116(1) * auVar55;
                lVar29 = 0;
                lVar30 = lVar17;
                do {
                  auVar5 = vpsubq_avx2(auVar54,auVar48);
                  auVar63 = vpsubq_avx2(auVar88,auVar105._0_32_);
                  uVar31 = auVar63._0_8_;
                  if ((long)auVar63._0_8_ < (long)auVar5._0_8_) {
                    uVar31 = auVar5._0_8_;
                  }
                  uVar12 = vpextrq_avx(auVar5._0_16_,1);
                  uVar21 = vpextrq_avx(auVar63._0_16_,1);
                  if ((long)uVar21 < (long)uVar12) {
                    uVar21 = uVar12;
                  }
                  uVar12 = auVar63._16_8_;
                  if ((long)auVar63._16_8_ < (long)auVar5._16_8_) {
                    uVar12 = auVar5._16_8_;
                  }
                  uVar13 = vpextrq_avx(auVar5._16_16_,1);
                  uVar23 = vpextrq_avx(auVar63._16_16_,1);
                  if ((long)uVar23 < (long)uVar13) {
                    uVar23 = uVar13;
                  }
                  uVar13 = *(ulong *)((long)*ptr + lVar29);
                  uVar32 = *(ulong *)((long)*ptr + lVar29 + 8);
                  uVar14 = uVar31;
                  if ((long)uVar31 < (long)uVar13) {
                    uVar14 = uVar13;
                  }
                  uVar13 = uVar21;
                  if ((long)uVar21 < (long)uVar32) {
                    uVar13 = uVar32;
                  }
                  uVar32 = *(ulong *)((long)*ptr + lVar29 + 0x10);
                  uVar15 = uVar12;
                  if ((long)uVar12 < (long)uVar32) {
                    uVar15 = uVar32;
                  }
                  uVar32 = *(ulong *)((long)*ptr + lVar29 + 0x18);
                  uVar38 = uVar23;
                  if ((long)uVar23 < (long)uVar32) {
                    uVar38 = uVar32;
                  }
                  uVar14 = ~((long)uVar14 >> 0x3f) & uVar14;
                  uVar13 = ~((long)uVar13 >> 0x3f) & uVar13;
                  uVar15 = ~((long)uVar15 >> 0x3f) & uVar15;
                  uVar38 = ~((long)uVar38 >> 0x3f) & uVar38;
                  uVar32 = auVar92._0_8_;
                  if ((long)uVar14 <= (long)auVar92._0_8_) {
                    uVar32 = uVar14;
                  }
                  uVar34 = vpextrq_avx(auVar92._0_16_,1);
                  if ((long)uVar13 <= (long)uVar34) {
                    uVar34 = uVar13;
                  }
                  uVar39 = auVar92._16_8_;
                  if ((long)uVar15 <= (long)auVar92._16_8_) {
                    uVar39 = uVar15;
                  }
                  uVar41 = vpextrq_avx(auVar92._16_16_,1);
                  if ((long)uVar38 <= (long)uVar41) {
                    uVar41 = uVar38;
                  }
                  uVar40 = auVar97._0_8_;
                  if ((long)auVar97._0_8_ <= (long)uVar14) {
                    uVar40 = uVar14;
                  }
                  uVar27 = vpextrq_avx(auVar97._0_16_,1);
                  if ((long)uVar27 <= (long)uVar13) {
                    uVar27 = uVar13;
                  }
                  uVar24 = auVar97._16_8_;
                  if ((long)auVar97._16_8_ <= (long)uVar15) {
                    uVar24 = uVar15;
                  }
                  uVar42 = vpextrq_avx(auVar97._16_16_,1);
                  if ((long)uVar42 <= (long)uVar38) {
                    uVar42 = uVar38;
                  }
                  auVar86._8_8_ = 0;
                  auVar86._0_8_ = uVar13;
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = uVar14;
                  auVar55 = vpunpcklqdq_avx(auVar98,auVar86);
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ = uVar15;
                  auVar89._0_16_ = ZEXT116(0) * auVar99 + ZEXT116(1) * auVar55;
                  auVar89._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar99;
                  auVar101._8_8_ = uVar38;
                  auVar101._0_8_ = uVar38;
                  auVar101._16_8_ = uVar38;
                  auVar101._24_8_ = uVar38;
                  auVar88 = vpblendd_avx2(auVar89,auVar101,0xc0);
                  *(undefined1 (*) [32])((long)*b_00 + lVar29) = auVar88;
                  piVar3 = ((ppVar10->field_4).rowcols)->score_row;
                  *(int *)((long)piVar3 + lVar30) = (int)uVar14;
                  uVar33 = auVar104._0_8_;
                  if ((long)auVar104._0_8_ < (long)uVar14) {
                    uVar33 = uVar14;
                  }
                  uVar14 = vpextrq_avx(auVar104._0_16_,1);
                  *(int *)((long)piVar3 + lVar26 * 4 + lVar30) = (int)uVar13;
                  if ((long)uVar14 < (long)uVar13) {
                    uVar14 = uVar13;
                  }
                  *(int *)((long)piVar3 + lVar26 * 8 + lVar30) = (int)uVar15;
                  uVar13 = auVar104._16_8_;
                  if ((long)auVar104._16_8_ < (long)uVar15) {
                    uVar13 = uVar15;
                  }
                  uVar15 = vpextrq_avx(auVar104._16_16_,1);
                  *(int *)((long)piVar3 + lVar26 * 0xc + lVar30) = (int)uVar38;
                  if ((long)uVar15 < (long)uVar38) {
                    uVar15 = uVar38;
                  }
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = uVar23;
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar12;
                  auVar55 = vpunpcklqdq_avx(auVar61,auVar47);
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = uVar21;
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar31;
                  auVar64 = vpunpcklqdq_avx(auVar81,auVar71);
                  auVar54._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar64;
                  auVar54._16_16_ = ZEXT116(1) * auVar55;
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = uVar41;
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = uVar39;
                  auVar55 = vpunpcklqdq_avx(auVar93,auVar91);
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = uVar34;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = uVar32;
                  auVar64 = vpunpcklqdq_avx(auVar96,auVar94);
                  auVar92._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar64;
                  auVar92._16_16_ = ZEXT116(1) * auVar55;
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = uVar42;
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = uVar24;
                  auVar55 = vpunpcklqdq_avx(auVar100,auVar95);
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = uVar27;
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ = uVar40;
                  auVar64 = vpunpcklqdq_avx(auVar103,auVar102);
                  auVar97._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar64;
                  auVar97._16_16_ = ZEXT116(1) * auVar55;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = uVar15;
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar13;
                  auVar55 = vpunpcklqdq_avx(auVar72,auVar62);
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar14;
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = uVar33;
                  auVar64 = vpunpcklqdq_avx(auVar82,auVar73);
                  auVar104._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar64;
                  auVar104._16_16_ = ZEXT116(1) * auVar55;
                  lVar29 = lVar29 + 0x20;
                  lVar30 = lVar30 + (ulong)(uint)s2Len * 4;
                } while (lVar37 != lVar29);
                auVar5 = vpcmpgtq_avx2(auVar104,local_d8);
                if ((((auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar5 >> 0x7f,0) != '\0') || SUB321(auVar5 >> 0xbf,0) != '\0') ||
                    auVar5[0x1f] < '\0') {
                  if ((long)uVar33 < (long)uVar13) {
                    uVar33 = uVar13;
                  }
                  if ((long)uVar14 < (long)uVar15) {
                    uVar14 = uVar15;
                  }
                  uVar25 = uVar14;
                  if ((long)uVar14 <= (long)uVar33) {
                    uVar25 = uVar33;
                  }
                  local_d8._8_8_ = uVar25;
                  local_d8._0_8_ = uVar25;
                  local_d8._16_8_ = uVar25;
                  local_d8._24_8_ = uVar25;
                  memcpy(__dest,b_00,size << 5);
                  auVar105 = ZEXT3264(CONCAT824(uVar35,CONCAT816(uVar35,CONCAT88(uVar35,uVar35))));
                  iVar106 = (int)uVar43;
                }
                uVar43 = uVar43 + 1;
                lVar17 = lVar17 + 4;
              } while (uVar43 != uVar11);
              if ((uVar19 & 0x7ffffffc) != 0) {
                uVar19 = 0;
                do {
                  if (((*__dest)[uVar19] == uVar25) &&
                     (uVar28 = ((uint)uVar19 & 3) * uVar36 + ((uint)(uVar19 >> 2) & 0x3fffffff),
                     (int)uVar28 < (int)uVar9)) {
                    uVar9 = (ulong)uVar28;
                  }
                  uVar28 = (uint)uVar9;
                  uVar19 = uVar19 + 1;
                } while ((uVar36 & 0x1fffffff) << 2 != (int)uVar19);
              }
              iVar8 = (int)uVar25;
              auVar6._8_8_ = uVar16;
              auVar6._0_8_ = uVar16;
              auVar6._16_8_ = uVar16;
              auVar6._24_8_ = uVar16;
              auVar49 = vpcmpgtq_avx2(auVar6,auVar92);
              auVar7._8_8_ = lVar22;
              auVar7._0_8_ = lVar22;
              auVar7._16_8_ = lVar22;
              auVar7._24_8_ = lVar22;
              auVar5 = vpcmpgtq_avx2(auVar97,auVar7);
              auVar49 = vpor_avx2(auVar5,auVar49);
              if ((((auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar49 >> 0x7f,0) != '\0') || SUB321(auVar49 >> 0xbf,0) != '\0') ||
                  auVar49[0x1f] < '\0') {
                *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                iVar8 = 0;
                iVar106 = 0;
                uVar28 = 0;
              }
              ppVar10->score = iVar8;
              ppVar10->end_query = uVar28;
              ppVar10->end_ref = iVar106;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b_00);
              parasail_free(ptr);
              parasail_free(b);
              return ppVar10;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        vH = _mm256_max_epi64_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}